

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O0

pair<int,_float> * __thiscall
directed_flag_complex_in_memory_t<std::pair<int,_float>_>::
get_data<directed_flag_complex_coboundary_cell_t>
          (directed_flag_complex_in_memory_t<std::pair<int,_float>_> *this,int dimension,
          directed_flag_complex_coboundary_cell_t *vertices)

{
  vertex_index_t vVar1;
  pair<int,_float> *ppVar2;
  directed_flag_complex_coboundary_cell_t *in_RDX;
  vector<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
  *in_RDI;
  int in_stack_00000014;
  directed_flag_complex_coboundary_cell_t *in_stack_00000018;
  int in_stack_00000024;
  directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> *in_stack_00000028;
  directed_flag_complex_coboundary_cell_t *in_stack_ffffffffffffff98;
  
  vVar1 = directed_flag_complex_cell_t::operator[]
                    (&in_RDX->super_directed_flag_complex_cell_t,(size_t)in_stack_ffffffffffffff98);
  std::
  vector<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
  ::operator[](in_RDI,(ulong)vVar1);
  directed_flag_complex_coboundary_cell_t::directed_flag_complex_coboundary_cell_t
            (in_RDX,in_stack_ffffffffffffff98);
  ppVar2 = directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>::
           get_data<directed_flag_complex_coboundary_cell_t>
                     (in_stack_00000028,in_stack_00000024,in_stack_00000018,in_stack_00000014);
  return ppVar2;
}

Assistant:

const ExtraData& get_data(int dimension, const Cell vertices) const {
		return vertex_cells[vertices[0]].get_data(dimension, vertices);
	}